

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

size_type __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::erase
          (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,key_type *k
          )

{
  bool bVar1;
  iterator local_48;
  undefined1 local_30 [8];
  iterator it;
  
  mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::find
            ((iterator *)local_30,
             &this->
              super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>,k);
  bVar1 = (treeNode<ft::pair<const_int,_int>_> *)it.m_tree !=
          (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
          super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
          .m_tree.m_last;
  if (bVar1) {
    local_48._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113c48;
    local_48.m_tree =
         (RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          *)it._vptr_treeIterator;
    local_48.m_node = (treeNode<ft::pair<const_int,_int>_> *)it.m_tree;
    erase(this,&local_48);
  }
  return (ulong)bVar1;
}

Assistant:

size_type	erase(key_type const & k)
	{
		iterator	it = this->find(k);
		if (it == this->end())
			return 0;
		this->erase(it);
		return 1;
	}